

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

void chaiscript::bootstrap::Bootstrap::bootstrap(Module *m)

{
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  *this_00;
  long lVar1;
  initializer_list<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_> __l_00;
  initializer_list<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  string local_1190;
  allocator_type local_116b [2];
  allocator<char> local_1169;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1168;
  undefined1 local_1158 [48];
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1128;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10f8;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10c8;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1098;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1068;
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1038;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1008;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  local_ff8;
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_fd0;
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_fb8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_fa0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f50;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f30;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f20;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_f00;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ef0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ee0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ed0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ec0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_eb0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ea0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e50;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e30;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e20;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_e00;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_df0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_de0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_dd0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_dc0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_db0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_da0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d50;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d30;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d20;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_d00;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_cf0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ce0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_cd0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_cc0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_cb0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ca0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c60;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c50;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c30;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c20;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c10;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_c00;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_bf0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_be0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_bd0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_bc0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_bb0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_ba0;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b90;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b80;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b70;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b40;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_b30;
  code *local_b20;
  undefined8 local_b18;
  code *local_b10;
  undefined8 local_b08;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_b00;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_af0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_ae0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_ad0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_ac0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_ab0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_aa0;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_a90;
  shared_ptr<chaiscript::detail::Type_Conversion_Base> local_a80;
  offset_in_AST_Node_to_unknown local_a70 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  code *local_40;
  undefined8 local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"void",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &void::typeinfo;
  local_1158._8_8_ = &void::typeinfo;
  local_1158._16_4_ = 8;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"bool",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &bool::typeinfo;
  local_1158._8_8_ = &bool::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Object",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &Boxed_Value::typeinfo;
  local_1158._8_8_ = &Boxed_Value::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Number",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &Boxed_Number::typeinfo;
  local_1158._8_8_ = &Boxed_Number::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Function",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::typeinfo;
  local_1158._8_8_ = &dispatch::Proxy_Function_Base::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Assignable_Function",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &dispatch::Assignable_Proxy_Function::typeinfo;
  local_1158._8_8_ = &dispatch::Assignable_Proxy_Function::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"exception",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &std::exception::typeinfo;
  local_1158._8_8_ = &std::exception::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  local_1158._0_8_ = dispatch::Proxy_Function_Base::get_arity;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<int(chaiscript::dispatch::Proxy_Function_Base::*)()noexcept_const,true,true,false,false,int,chaiscript::dispatch::Proxy_Function_Base_const&>
            (&local_b30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"get_arity",(allocator<char> *)&local_1190);
  this = &m->m_funcs;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b30,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b30.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = (type_info *)0x11;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::dispatch::Proxy_Function_Base::*)(chaiscript::dispatch::Proxy_Function_Base_const&)noexcept_const,true,true,false,false,bool,chaiscript::dispatch::Proxy_Function_Base_const&,chaiscript::dispatch::Proxy_Function_Base_const&>
            (&local_b40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"==",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b40,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Proxy_Function_Base::get_param_types;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>(chaiscript::dispatch::Proxy_Function_Base_const*),chaiscript::bootstrap::Bootstrap::return_boxed_value_vector<std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>const&(chaiscript::dispatch::Proxy_Function_Base::*)()noexcept_const>(std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>const&(chaiscript::dispatch::Proxy_Function_Base::*const&)()noexcept_const)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const*)_1_>,chaiscript::bootstrap::Bootstrap::return_boxed_value_vector<std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>const&(chaiscript::dispatch::Proxy_Function_Base::*)()noexcept_const>(std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>const&(chaiscript::dispatch::Proxy_Function_Base::*const&)()noexcept_const)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const*)_1_>
            ((anon_class_16_1_54a39806_for_m_f *)local_b50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"get_param_types",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_b50,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b50 + 8));
  local_1158._0_8_ = (type_info *)0x29;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>(chaiscript::dispatch::Proxy_Function_Base_const*),chaiscript::bootstrap::Bootstrap::return_boxed_value_vector<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*)()const>(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*const&)()const)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const*)_1_>,chaiscript::bootstrap::Bootstrap::return_boxed_value_vector<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*)()const>(std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>(chaiscript::dispatch::Proxy_Function_Base::*const&)()const)::_lambda(chaiscript::dispatch::Proxy_Function_Base_const*)_1_>
            ((anon_class_16_1_54a39806_for_m_f *)local_b60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"get_contained_functions",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)local_b60,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b60 + 8));
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(std::exception_const&),chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(std::exception_const&)_1_>,chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(std::exception_const&)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_b70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"what",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b70,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b70.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"out_of_range",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &std::out_of_range::typeinfo;
  local_1158._8_8_ = &std::out_of_range::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"logic_error",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &std::logic_error::typeinfo;
  local_1158._8_8_ = &std::logic_error::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::exception,std::logic_error>>
            ();
  this_00 = &m->m_conversions;
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_a80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a80.
              super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::logic_error,std::out_of_range>>
            ();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_a90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a90.
              super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::exception,std::out_of_range>>
            ();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_aa0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_aa0.
              super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"runtime_error",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &std::runtime_error::typeinfo;
  local_1158._8_8_ = &std::runtime_error::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::exception,std::runtime_error>>
            ();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_ab0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ab0.
              super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  constructor<std::runtime_error(std::__cxx11::string_const&)>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"runtime_error",(allocator<char> *)local_1158);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b80,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b80.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"Dynamic_Object",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &dispatch::Dynamic_Object::typeinfo;
  local_1158._8_8_ = &dispatch::Dynamic_Object::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  constructor<chaiscript::dispatch::Dynamic_Object(std::__cxx11::string_const&)>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"Dynamic_Object",(allocator<char> *)local_1158);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_b90,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b90.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  constructor<chaiscript::dispatch::Dynamic_Object()>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"Dynamic_Object",(allocator<char> *)local_1158);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ba0,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ba0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::get_type_name_abi_cxx11_;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string_const&(chaiscript::dispatch::Dynamic_Object::*)()noexcept_const,true,true,false,false,std::__cxx11::string_const&,chaiscript::dispatch::Dynamic_Object_const&>
            (&local_bb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"get_type_name",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_bb0,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_bb0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::get_attrs_abi_cxx11_;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>(chaiscript::dispatch::Dynamic_Object::*)()const,false,true,false,false,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>,chaiscript::dispatch::Dynamic_Object_const&>
            (&local_bc0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"get_attrs",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_bc0,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_bc0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::set_explicit;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<void(chaiscript::dispatch::Dynamic_Object::*)(bool)noexcept,true,true,false,false,void,chaiscript::dispatch::Dynamic_Object&,bool>
            (&local_bd0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"set_explicit",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_bd0,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_bd0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::is_explicit;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::dispatch::Dynamic_Object::*)()noexcept_const,true,true,false,false,bool,chaiscript::dispatch::Dynamic_Object_const&>
            (&local_be0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"is_explicit",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_be0,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_be0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::has_attr;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,bool,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
            (&local_bf0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"has_attr",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_bf0,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_bf0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::get_attr;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::dispatch::Dynamic_Object&,std::__cxx11::string_const&>
            (&local_c00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"get_attr",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c00,&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c00.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::get_attr;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value_const&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,chaiscript::Boxed_Value_const&,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
            (&local_c10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_380,"get_attr",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c10,&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c10.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::method_missing;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::dispatch::Dynamic_Object&,std::__cxx11::string_const&>
            (&local_c20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"method_missing",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c20,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c20.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::method_missing;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value_const&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,chaiscript::Boxed_Value_const&,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
            (&local_c30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"method_missing",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c30,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c30.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::get_attr;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::dispatch::Dynamic_Object&,std::__cxx11::string_const&>
            (&local_c40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e0,"[]",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c40,&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = dispatch::Dynamic_Object::get_attr;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value_const&(chaiscript::dispatch::Dynamic_Object::*)(std::__cxx11::string_const&)const,false,true,false,false,chaiscript::Boxed_Value_const&,chaiscript::dispatch::Dynamic_Object_const&,std::__cxx11::string_const&>
            (&local_c50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"[]",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c50,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c50.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,
             "\n          def Dynamic_Object::clone() {\n            auto &new_o = Dynamic_Object(this.get_type_name());\n            for_each(this.get_attrs(), fun[new_o](x) { new_o.get_attr(x.first) = x.second; } );\n            new_o;\n          }\n\n          def `=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()\n          {\n            for_each(rhs.get_attrs(), fun[lhs](x) { lhs.get_attr(x.first) = clone(x.second); } );\n          }\n\n          def `!=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()\n          {\n            var rhs_attrs := rhs.get_attrs();\n            var lhs_attrs := lhs.get_attrs();\n\n            if (rhs_attrs.size() != lhs_attrs.size()) {\n              true;\n            } else {\n              return any_of(rhs_attrs, fun[lhs](x) { !lhs.has_attr(x.first) || lhs.get_attr(x.first) != x.second; } );\n            }\n          }\n\n          def `==`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()\n          {\n            var rhs_attrs := rhs.get_attrs();\n            var lhs_attrs := lhs.get_attrs();\n\n            if (rhs_attrs.size() != lhs_attrs.size()) {\n              false;\n            } else {\n              return all_of(rhs_attrs, fun[lhs](x) { lhs.has_attr(x.first) && lhs.get_attr(x.first) == x.second; } );\n            }\n          }\n        "
             ,(allocator<char> *)local_1158);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&m->m_evals,
             &local_420);
  std::__cxx11::string::~string((string *)&local_420);
  local_1158._0_8_ = has_guard;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept>,bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept>
            ((chaiscript *)&local_c60,
             (_func_bool_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr **)
             local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"has_guard",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c60,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c60.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = get_guard;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
            ((chaiscript *)&local_c70,
             (_func_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
              **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"get_guard",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c70,&local_460);
  std::__cxx11::string::~string((string *)&local_460);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c70.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::is_undef;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_c80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"is_var_undef",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c80,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c80.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::is_null;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_c90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"is_var_null",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_c90,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c90.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::is_const;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_ca0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"is_var_const",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ca0,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ca0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::is_ref;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_cb0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"is_var_reference",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_cb0,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_cb0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::is_pointer;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_cc0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"is_var_pointer",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_cc0,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_cc0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::is_return_value;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&>
            (&local_cd0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_520,"is_var_return_value",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_cd0,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_cd0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::reset_return_value;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<void(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,void,chaiscript::Boxed_Value_const&>
            (&local_ce0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,"reset_var_return_value",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ce0,&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ce0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::is_type;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Boxed_Value::*)(chaiscript::Type_Info_const&)noexcept_const,true,true,false,false,bool,chaiscript::Boxed_Value_const&,chaiscript::Type_Info_const&>
            (&local_cf0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"is_type",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_cf0,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_cf0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::get_attr;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value(chaiscript::Boxed_Value::*)(std::__cxx11::string_const&),false,true,false,false,chaiscript::Boxed_Value,chaiscript::Boxed_Value&,std::__cxx11::string_const&>
            (&local_d00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,"get_var_attr",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d00,&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d00.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::copy_attrs;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::Boxed_Value::*)(chaiscript::Boxed_Value_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::Boxed_Value&,chaiscript::Boxed_Value_const&>
            (&local_d10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"copy_var_attrs",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d10,&local_5a0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d10.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::clone_attrs;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Boxed_Value&(chaiscript::Boxed_Value::*)(chaiscript::Boxed_Value_const&),false,true,false,false,chaiscript::Boxed_Value&,chaiscript::Boxed_Value&,chaiscript::Boxed_Value_const&>
            (&local_d20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"clone_var_attrs",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d20,&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d20.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::get_type_info;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<chaiscript::Type_Info_const&(chaiscript::Boxed_Value::*)()noexcept_const,true,true,false,false,chaiscript::Type_Info_const&,chaiscript::Boxed_Value_const&>
            (&local_d30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,"get_type_info",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d30,&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d30.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"Type_Info",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &Type_Info::typeinfo;
  local_1158._8_8_ = &Type_Info::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  constructor<chaiscript::Type_Info(chaiscript::Type_Info_const&)>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"Type_Info",(allocator<char> *)local_1158);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d40,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  operators::equal<chaiscript::Type_Info>(m);
  local_1158._0_8_ = Type_Info::is_const;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_640,"is_type_const",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d50,&local_640);
  std::__cxx11::string::~string((string *)&local_640);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d50.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Type_Info::is_reference;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_660,"is_type_reference",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d60,&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d60.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Type_Info::is_void;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,"is_type_void",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d70,&local_680);
  std::__cxx11::string::~string((string *)&local_680);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d70.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Type_Info::is_undef;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a0,"is_type_undef",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d80,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d80.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Type_Info::is_pointer;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_d90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"is_type_pointer",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_d90,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d90.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Type_Info::is_arithmetic;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&>
            (&local_da0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e0,"is_type_arithmetic",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_da0,&local_6e0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_da0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Type_Info::name;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<char_const*(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,char_const*,chaiscript::Type_Info_const&>
            (&local_db0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_700,"cpp_name",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_db0,&local_700);
  std::__cxx11::string::~string((string *)&local_700);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_db0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Type_Info::bare_name;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<char_const*(chaiscript::Type_Info::*)()noexcept_const,true,true,false,false,char_const*,chaiscript::Type_Info_const&>
            (&local_dc0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"cpp_bare_name",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_dc0,&local_720);
  std::__cxx11::string::~string((string *)&local_720);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_dc0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Type_Info::bare_equal;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<bool(chaiscript::Type_Info::*)(chaiscript::Type_Info_const&)noexcept_const,true,true,false,false,bool,chaiscript::Type_Info_const&,chaiscript::Type_Info_const&>
            (&local_dd0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,"bare_equal",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_dd0,&local_740);
  std::__cxx11::string::~string((string *)&local_740);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_dd0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"bool",(allocator<char> *)&local_1190);
  basic_constructors<bool>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  operators::assign<bool>(m);
  operators::equal<bool>(m);
  operators::not_equal<bool>(m);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(std::__cxx11::string_const&),chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(std::__cxx11::string_const&)_1_>,chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(std::__cxx11::string_const&)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_de0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"to_string",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_de0,&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_de0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(bool),chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(bool)_1_>,chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(bool)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_df0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_780,"to_string",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_df0,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_df0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = unknown_assign;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Value(chaiscript::Boxed_Value,chaiscript::Boxed_Value),chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,chaiscript::Boxed_Value)>,chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,chaiscript::Boxed_Value)>
            ((chaiscript *)&local_e00,(_func_Boxed_Value_Boxed_Value_Boxed_Value **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a0,"=",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e00,&local_7a0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e00.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(chaiscript::Boxed_Value_const&),chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::Boxed_Value_const&)_1_>,chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::Boxed_Value_const&)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_e10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"throw",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e10,&local_7c0);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e10.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(char),chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(char)_1_>,chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(char)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_e20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e0,"to_string",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e20,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e20.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Number::to_string_abi_cxx11_;
  local_1158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(chaiscript::Boxed_Number::*)()const,false,true,false,false,std::__cxx11::string,chaiscript::Boxed_Number_const&>
            (&local_e30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,"to_string",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e30,&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e30.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"double",(allocator<char> *)&local_1190);
  bootstrap_pod_type<double>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"long_double",(allocator<char> *)&local_1190);
  bootstrap_pod_type<long_double>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"float",(allocator<char> *)&local_1190);
  bootstrap_pod_type<float>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"int",(allocator<char> *)&local_1190);
  bootstrap_pod_type<int>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"long",(allocator<char> *)&local_1190);
  bootstrap_pod_type<long>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"unsigned_int",(allocator<char> *)&local_1190);
  bootstrap_pod_type<unsigned_int>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"unsigned_long",(allocator<char> *)&local_1190);
  bootstrap_pod_type<unsigned_long>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"long_long",(allocator<char> *)&local_1190);
  bootstrap_pod_type<long_long>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"unsigned_long_long",(allocator<char> *)&local_1190);
  bootstrap_pod_type<unsigned_long_long>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"size_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<unsigned_long>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"char",(allocator<char> *)&local_1190);
  bootstrap_pod_type<char>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"wchar_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<wchar_t>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"char16_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<char16_t>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"char32_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<char32_t>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"int8_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<signed_char>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"int16_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<short>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"int32_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<int>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"int64_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<long>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"uint8_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<unsigned_char>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"uint16_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<unsigned_short>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"uint32_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<unsigned_int>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1158,"uint64_t",(allocator<char> *)&local_1190);
  bootstrap_pod_type<unsigned_long>((string *)local_1158,m);
  std::__cxx11::string::~string((string *)local_1158);
  operators::logical_compliment<bool>(m);
  opers_arithmetic_pod(m);
  local_1158._0_8_ = Build_Info::version_major;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<int(),int(*)()noexcept>,int(*)()noexcept>
            ((chaiscript *)&local_e40,(_func_int **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_820,"version_major",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e40,&local_820);
  std::__cxx11::string::~string((string *)&local_820);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Build_Info::version_minor;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<int(),int(*)()noexcept>,int(*)()noexcept>
            ((chaiscript *)&local_e50,(_func_int **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"version_minor",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e50,&local_840);
  std::__cxx11::string::~string((string *)&local_840);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e50.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Build_Info::version_patch;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<int(),int(*)()noexcept>,int(*)()noexcept>
            ((chaiscript *)&local_e60,(_func_int **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_860,"version_patch",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e60,&local_860);
  std::__cxx11::string::~string((string *)&local_860);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e60.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Build_Info::version_abi_cxx11_;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(),std::__cxx11::string(*)()>,std::__cxx11::string(*)()>
            ((chaiscript *)&local_e70,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1158)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,"version",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e70,&local_880);
  std::__cxx11::string::~string((string *)&local_880);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e70.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Build_Info::compiler_version_abi_cxx11_;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(),std::__cxx11::string(*)()>,std::__cxx11::string(*)()>
            ((chaiscript *)&local_e80,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1158)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"compiler_version",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e80,&local_8a0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e80.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Build_Info::compiler_name_abi_cxx11_;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(),std::__cxx11::string(*)()>,std::__cxx11::string(*)()>
            ((chaiscript *)&local_e90,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1158)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c0,"compiler_name",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_e90,&local_8c0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e90.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Build_Info::compiler_id_abi_cxx11_;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::__cxx11::string(),std::__cxx11::string(*)()>,std::__cxx11::string(*)()>
            ((chaiscript *)&local_ea0,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1158)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e0,"compiler_id",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ea0,&local_8e0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ea0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Build_Info::debug_build;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(),bool(*)()noexcept>,bool(*)()noexcept>
            ((chaiscript *)&local_eb0,(_func_bool **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"debug_build",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_eb0,&local_900);
  std::__cxx11::string::~string((string *)&local_900);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_eb0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = print;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(std::__cxx11::string_const&),void(*)(std::__cxx11::string_const&)noexcept>,void(*)(std::__cxx11::string_const&)noexcept>
            ((chaiscript *)&local_ec0,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **)
             local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_920,"print_string",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ec0,&local_920);
  std::__cxx11::string::~string((string *)&local_920);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ec0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = println;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(std::__cxx11::string_const&),void(*)(std::__cxx11::string_const&)noexcept>,void(*)(std::__cxx11::string_const&)noexcept>
            ((chaiscript *)&local_ed0,
             (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **)
             local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,"println_string",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ed0,&local_940);
  std::__cxx11::string::~string((string *)&local_940);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ed0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = bind_function;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value(*)(chaiscript::Function_Params_const&)>,chaiscript::Boxed_Value(*)(chaiscript::Function_Params_const&)>
            ((chaiscript *)&local_ee0,(_func_Boxed_Value_Function_Params_ptr **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"bind",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ee0,&local_960);
  std::__cxx11::string::~string((string *)&local_960);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ee0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = shared_ptr_unconst_clone<chaiscript::dispatch::Proxy_Function_Base>;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
            ((chaiscript *)&local_ef0,
             (_func_shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
              **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"clone",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_ef0,&local_980);
  std::__cxx11::string::~string((string *)&local_980);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ef0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = ptr_assign<chaiscript::dispatch::Proxy_Function_Base>;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Value(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&),chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)>,chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)>
            ((chaiscript *)&local_f00,
             (_func_Boxed_Value_Boxed_Value_shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_ptr
              **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"=",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f00,&local_9a0);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f00.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = ptr_assign<chaiscript::dispatch::Proxy_Function_Base_const>;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::Boxed_Value(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>,chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
            ((chaiscript *)&local_f10,
             (_func_Boxed_Value_Boxed_Value_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
              **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c0,"=",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f10,&local_9c0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f10.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Assignable_Proxy_Function>>
            ();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_ac0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ac0.
              super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<void(chaiscript::dispatch::Assignable_Proxy_Function&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::dispatch::Assignable_Proxy_Function&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)_1_>,chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::dispatch::Assignable_Proxy_Function&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_f20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e0,"=",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f20,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f20.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = Boxed_Value::type_match;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&),bool(*)(chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)noexcept>,bool(*)(chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)noexcept>
            ((chaiscript *)&local_f30,(_func_bool_Boxed_Value_ptr_Boxed_Value_ptr **)local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a00,"type_match",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f30,&local_a00);
  std::__cxx11::string::~string((string *)&local_a00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f30.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = has_parse_tree;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<bool(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept>,bool(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)noexcept>
            ((chaiscript *)&local_f40,
             (_func_bool_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr **)
             local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a20,"has_parse_tree",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f40,&local_a20);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_1158._0_8_ = get_parse_tree;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<chaiscript::AST_Node_const&(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&),chaiscript::AST_Node_const&(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>,chaiscript::AST_Node_const&(*)(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&)>
            ((chaiscript *)&local_f50,
             (_func_AST_Node_ptr_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr **)
             local_1158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a40,"get_parse_tree",(allocator<char> *)&local_1190);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)this,&local_f50,&local_a40);
  std::__cxx11::string::~string((string *)&local_a40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f50.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::runtime_error,chaiscript::exception::eval_error>>
            ();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_ad0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ad0.
              super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::exception,chaiscript::exception::eval_error>>
            ();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_ae0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_ae0.
              super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a60,"arithmetic_error",(allocator<char> *)&local_1190);
  local_1158._0_8_ = &exception::arithmetic_error::typeinfo;
  local_1158._8_8_ = &exception::arithmetic_error::typeinfo;
  local_1158._16_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info&,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)m,(Type_Info *)local_1158,&local_a60);
  std::__cxx11::string::~string((string *)&local_a60);
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::runtime_error,chaiscript::exception::arithmetic_error>>
            ();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_af0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_af0.
              super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Dynamic_Conversion_Impl<std::exception,chaiscript::exception::arithmetic_error>>
            ();
  std::
  vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
  ::emplace_back<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>
            ((vector<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>>>
              *)this_00,&local_b00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b00.
              super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1190,"eval_error",(allocator<char> *)&local_b10);
  local_ff8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ff8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ff8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f90.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x10;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Attribute_Access<std::__cxx11::string,chaiscript::exception::eval_error>,std::__cxx11::string_chaiscript::exception::eval_error::*>
            ((chaiscript *)&local_fd0,
             (offset_in_eval_error_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)&local_f90);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[7],_true>
            ((pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1158,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_fd0,
             (char (*) [7])"reason");
  local_1008.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)exception::eval_error::pretty_print_abi_cxx11_;
  local_1008.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(chaiscript::exception::eval_error::*)()const,false,true,false,false,std::__cxx11::string,chaiscript::exception::eval_error_const&>
            (&local_1168);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[13],_true>
            (&local_1128,&local_1168,(char (*) [13])"pretty_print");
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>(chaiscript::exception::eval_error_const&),chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::exception::eval_error_const&)_1_>,chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::exception::eval_error_const&)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_f80);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[11],_true>
            (&local_10f8,&local_f80,(char (*) [11])"call_stack");
  __l._M_len = 3;
  __l._M_array = (iterator)local_1158;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_fb8,__l,(allocator_type *)&local_b20);
  utility::add_class<chaiscript::exception::eval_error,chaiscript::Module>
            (m,&local_1190,&local_ff8,&local_fb8);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_fb8);
  lVar1 = 0x60;
  do {
    std::
    pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_1158 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f80.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1168.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_fd0.
              super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_ff8);
  std::__cxx11::string::~string((string *)&local_1190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1190,"File_Position",(allocator<char> *)&local_b10);
  constructor<chaiscript::File_Position()>();
  constructor<chaiscript::File_Position(int,int)>();
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_ff8;
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::vector((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
            *)&local_fb8,__l_00,(allocator_type *)&local_fa0);
  local_f80.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Attribute_Access<int,chaiscript::File_Position>,int_chaiscript::File_Position::*>
            ((chaiscript *)&local_1168,(offset_in_File_Position_to_int *)&local_f80);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[5],_true>
            ((pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1158,&local_1168,(char (*) [5])"line");
  local_f90.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x4;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Attribute_Access<int,chaiscript::File_Position>,int_chaiscript::File_Position::*>
            ((chaiscript *)&local_1008,(offset_in_File_Position_to_int *)&local_f90);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[7],_true>
            (&local_1128,&local_1008,(char (*) [7])"column");
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_1158;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_fd0,__l_01,(allocator_type *)&local_b20);
  utility::add_class<chaiscript::File_Position,chaiscript::Module>
            (m,&local_1190,
             (vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)&local_fb8,&local_fd0);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_fd0);
  lVar1 = 0x30;
  do {
    std::
    pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_1158 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1008.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1168.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             *)&local_fb8);
  lVar1 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_ff8.
                       super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  std::__cxx11::string::~string((string *)&local_1190);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1190,"AST_Node",&local_1169);
  local_ff8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ff8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ff8.
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a70[1] = 0x10;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Attribute_Access<std::__cxx11::string_const,chaiscript::AST_Node>,std::__cxx11::string_const_chaiscript::AST_Node::*>
            ((chaiscript *)&local_fd0,local_a70 + 1);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[5],_true>
            ((pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1158,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)&local_fd0,
             (char (*) [5])"text");
  local_a70[0] = 8;
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Attribute_Access<chaiscript::AST_Node_Type_const,chaiscript::AST_Node>,chaiscript::AST_Node_Type_const_chaiscript::AST_Node::*>
            ((chaiscript *)&local_1168,local_a70);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[11],_true>
            (&local_1128,&local_1168,(char (*) [11])"identifier");
  local_f80.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)AST_Node::filename_abi_cxx11_;
  local_f80.
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string_const&(chaiscript::AST_Node::*)()noexcept_const,true,true,false,false,std::__cxx11::string_const&,chaiscript::AST_Node_const&>
            (&local_1008);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[9],_true>
            (&local_10f8,&local_1008,(char (*) [9])"filename");
  local_b10 = AST_Node::start;
  local_b08 = 0;
  dispatch::detail::
  make_callable_impl<chaiscript::File_Position_const&(chaiscript::AST_Node::*)()noexcept_const,true,true,false,false,chaiscript::File_Position_const&,chaiscript::AST_Node_const&>
            (&local_f90);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[6],_true>
            (&local_10c8,&local_f90,(char (*) [6])"start");
  local_b20 = AST_Node::end;
  local_b18 = 0;
  dispatch::detail::
  make_callable_impl<chaiscript::File_Position_const&(chaiscript::AST_Node::*)()noexcept_const,true,true,false,false,chaiscript::File_Position_const&,chaiscript::AST_Node_const&>
            (&local_fa0);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[4],_true>
            (&local_1098,&local_fa0,(char (*) [4])0x353b78);
  local_40 = AST_Node::to_string;
  local_38 = 0;
  dispatch::detail::
  make_callable_impl<std::__cxx11::string(chaiscript::AST_Node::*)(std::__cxx11::string_const&)const,false,true,false,false,std::__cxx11::string,chaiscript::AST_Node_const&,std::__cxx11::string_const&>
            (&local_f60);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[10],_true>
            (&local_1068,&local_f60,(char (*) [10])"to_string");
  make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Proxy_Function_Callable_Impl<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>(chaiscript::AST_Node_const&),chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::AST_Node_const&)_1_>,chaiscript::bootstrap::Bootstrap::bootstrap(chaiscript::Module&)::_lambda(chaiscript::AST_Node_const&)_1_>
            ((anon_class_1_0_00000001_for_m_f *)&local_f70);
  std::
  pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_const_char_(&)[9],_true>
            (&local_1038,&local_f70,(char (*) [9])"children");
  __l_02._M_len = 7;
  __l_02._M_array = (iterator)local_1158;
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_fb8,__l_02,local_116b);
  utility::add_class<chaiscript::AST_Node,chaiscript::Module>(m,&local_1190,&local_ff8,&local_fb8);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_fb8);
  lVar1 = 0x120;
  do {
    std::
    pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_1158 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f70.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f60.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_fa0.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f90.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1008.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1168.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_fd0.
              super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&local_ff8);
  std::__cxx11::string::~string((string *)&local_1190);
  return;
}

Assistant:

static void bootstrap(Module &m) {
      m.add(user_type<void>(), "void");
      m.add(user_type<bool>(), "bool");
      m.add(user_type<Boxed_Value>(), "Object");
      m.add(user_type<Boxed_Number>(), "Number");
      m.add(user_type<Proxy_Function>(), "Function");
      m.add(user_type<dispatch::Assignable_Proxy_Function>(), "Assignable_Function");
      m.add(user_type<std::exception>(), "exception");

      m.add(fun(&dispatch::Proxy_Function_Base::get_arity), "get_arity");
      m.add(fun(&dispatch::Proxy_Function_Base::operator==), "==");

      m.add(fun(return_boxed_value_vector(&dispatch::Proxy_Function_Base::get_param_types)), "get_param_types");
      m.add(fun(return_boxed_value_vector(&dispatch::Proxy_Function_Base::get_contained_functions)), "get_contained_functions");

      m.add(fun([](const std::exception &e) { return std::string(e.what()); }), "what");

      m.add(user_type<std::out_of_range>(), "out_of_range");
      m.add(user_type<std::logic_error>(), "logic_error");
      m.add(chaiscript::base_class<std::exception, std::logic_error>());
      m.add(chaiscript::base_class<std::logic_error, std::out_of_range>());
      m.add(chaiscript::base_class<std::exception, std::out_of_range>());

      m.add(user_type<std::runtime_error>(), "runtime_error");
      m.add(chaiscript::base_class<std::exception, std::runtime_error>());

      m.add(constructor<std::runtime_error(const std::string &)>(), "runtime_error");

      m.add(user_type<dispatch::Dynamic_Object>(), "Dynamic_Object");
      m.add(constructor<dispatch::Dynamic_Object(const std::string &)>(), "Dynamic_Object");
      m.add(constructor<dispatch::Dynamic_Object()>(), "Dynamic_Object");
      m.add(fun(&dispatch::Dynamic_Object::get_type_name), "get_type_name");
      m.add(fun(&dispatch::Dynamic_Object::get_attrs), "get_attrs");
      m.add(fun(&dispatch::Dynamic_Object::set_explicit), "set_explicit");
      m.add(fun(&dispatch::Dynamic_Object::is_explicit), "is_explicit");
      m.add(fun(&dispatch::Dynamic_Object::has_attr), "has_attr");

      m.add(fun(static_cast<Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &)>(&dispatch::Dynamic_Object::get_attr)), "get_attr");
      m.add(fun(static_cast<const Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &) const>(&dispatch::Dynamic_Object::get_attr)),
            "get_attr");

      m.add(fun(static_cast<Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &)>(&dispatch::Dynamic_Object::method_missing)),
            "method_missing");
      m.add(fun(static_cast<const Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &) const>(
                &dispatch::Dynamic_Object::method_missing)),
            "method_missing");

      m.add(fun(static_cast<Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &)>(&dispatch::Dynamic_Object::get_attr)), "[]");
      m.add(fun(static_cast<const Boxed_Value &(dispatch::Dynamic_Object::*)(const std::string &) const>(&dispatch::Dynamic_Object::get_attr)),
            "[]");

      m.eval(R"chaiscript(
          def Dynamic_Object::clone() {
            auto &new_o = Dynamic_Object(this.get_type_name());
            for_each(this.get_attrs(), fun[new_o](x) { new_o.get_attr(x.first) = x.second; } );
            new_o;
          }

          def `=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()
          {
            for_each(rhs.get_attrs(), fun[lhs](x) { lhs.get_attr(x.first) = clone(x.second); } );
          }

          def `!=`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()
          {
            var rhs_attrs := rhs.get_attrs();
            var lhs_attrs := lhs.get_attrs();

            if (rhs_attrs.size() != lhs_attrs.size()) {
              true;
            } else {
              return any_of(rhs_attrs, fun[lhs](x) { !lhs.has_attr(x.first) || lhs.get_attr(x.first) != x.second; } );
            }
          }

          def `==`(Dynamic_Object lhs, Dynamic_Object rhs) : lhs.get_type_name() == rhs.get_type_name()
          {
            var rhs_attrs := rhs.get_attrs();
            var lhs_attrs := lhs.get_attrs();

            if (rhs_attrs.size() != lhs_attrs.size()) {
              false;
            } else {
              return all_of(rhs_attrs, fun[lhs](x) { lhs.has_attr(x.first) && lhs.get_attr(x.first) == x.second; } );
            }
          }
        )chaiscript");

      m.add(fun(&has_guard), "has_guard");
      m.add(fun(&get_guard), "get_guard");

      m.add(fun(&Boxed_Value::is_undef), "is_var_undef");
      m.add(fun(&Boxed_Value::is_null), "is_var_null");
      m.add(fun(&Boxed_Value::is_const), "is_var_const");
      m.add(fun(&Boxed_Value::is_ref), "is_var_reference");
      m.add(fun(&Boxed_Value::is_pointer), "is_var_pointer");
      m.add(fun(&Boxed_Value::is_return_value), "is_var_return_value");
      m.add(fun(&Boxed_Value::reset_return_value), "reset_var_return_value");
      m.add(fun(&Boxed_Value::is_type), "is_type");
      m.add(fun(&Boxed_Value::get_attr), "get_var_attr");
      m.add(fun(&Boxed_Value::copy_attrs), "copy_var_attrs");
      m.add(fun(&Boxed_Value::clone_attrs), "clone_var_attrs");

      m.add(fun(&Boxed_Value::get_type_info), "get_type_info");
      m.add(user_type<Type_Info>(), "Type_Info");
      m.add(constructor<Type_Info(const Type_Info &)>(), "Type_Info");

      operators::equal<Type_Info>(m);

      m.add(fun(&Type_Info::is_const), "is_type_const");
      m.add(fun(&Type_Info::is_reference), "is_type_reference");
      m.add(fun(&Type_Info::is_void), "is_type_void");
      m.add(fun(&Type_Info::is_undef), "is_type_undef");
      m.add(fun(&Type_Info::is_pointer), "is_type_pointer");
      m.add(fun(&Type_Info::is_arithmetic), "is_type_arithmetic");
      m.add(fun(&Type_Info::name), "cpp_name");
      m.add(fun(&Type_Info::bare_name), "cpp_bare_name");
      m.add(fun(&Type_Info::bare_equal), "bare_equal");

      basic_constructors<bool>("bool", m);
      operators::assign<bool>(m);
      operators::equal<bool>(m);
      operators::not_equal<bool>(m);

      m.add(fun([](const std::string &s) { return s; }), "to_string");
      m.add(fun([](const bool b) { return std::string(b ? "true" : "false"); }), "to_string");
      m.add(fun(&unknown_assign), "=");
      m.add(fun([](const Boxed_Value &bv) { throw bv; }), "throw");

      m.add(fun([](const char c) { return std::string(1, c); }), "to_string");
      m.add(fun(&Boxed_Number::to_string), "to_string");

      bootstrap_pod_type<double>("double", m);
      bootstrap_pod_type<long double>("long_double", m);
      bootstrap_pod_type<float>("float", m);
      bootstrap_pod_type<int>("int", m);
      bootstrap_pod_type<long>("long", m);
      bootstrap_pod_type<unsigned int>("unsigned_int", m);
      bootstrap_pod_type<unsigned long>("unsigned_long", m);
      bootstrap_pod_type<long long>("long_long", m);
      bootstrap_pod_type<unsigned long long>("unsigned_long_long", m);
      bootstrap_pod_type<size_t>("size_t", m);
      bootstrap_pod_type<char>("char", m);
      bootstrap_pod_type<wchar_t>("wchar_t", m);
      bootstrap_pod_type<char16_t>("char16_t", m);
      bootstrap_pod_type<char32_t>("char32_t", m);
      bootstrap_pod_type<std::int8_t>("int8_t", m);
      bootstrap_pod_type<std::int16_t>("int16_t", m);
      bootstrap_pod_type<std::int32_t>("int32_t", m);
      bootstrap_pod_type<std::int64_t>("int64_t", m);
      bootstrap_pod_type<std::uint8_t>("uint8_t", m);
      bootstrap_pod_type<std::uint16_t>("uint16_t", m);
      bootstrap_pod_type<std::uint32_t>("uint32_t", m);
      bootstrap_pod_type<std::uint64_t>("uint64_t", m);

      operators::logical_compliment<bool>(m);

      opers_arithmetic_pod(m);

      m.add(fun(&Build_Info::version_major), "version_major");
      m.add(fun(&Build_Info::version_minor), "version_minor");
      m.add(fun(&Build_Info::version_patch), "version_patch");
      m.add(fun(&Build_Info::version), "version");
      m.add(fun(&Build_Info::compiler_version), "compiler_version");
      m.add(fun(&Build_Info::compiler_name), "compiler_name");
      m.add(fun(&Build_Info::compiler_id), "compiler_id");
      m.add(fun(&Build_Info::debug_build), "debug_build");

      m.add(fun(&print), "print_string");
      m.add(fun(&println), "println_string");

      m.add(dispatch::make_dynamic_proxy_function(&bind_function), "bind");

      m.add(fun(&shared_ptr_unconst_clone<dispatch::Proxy_Function_Base>), "clone");
      m.add(fun(&ptr_assign<std::remove_const<dispatch::Proxy_Function_Base>::type>), "=");
      m.add(fun(&ptr_assign<std::add_const<dispatch::Proxy_Function_Base>::type>), "=");
      m.add(chaiscript::base_class<dispatch::Proxy_Function_Base, dispatch::Assignable_Proxy_Function>());
      m.add(fun([](dispatch::Assignable_Proxy_Function &t_lhs, const std::shared_ptr<const dispatch::Proxy_Function_Base> &t_rhs) {
              t_lhs.assign(t_rhs);
            }),
            "=");

      m.add(fun(&Boxed_Value::type_match), "type_match");

      m.add(chaiscript::fun(&has_parse_tree), "has_parse_tree");
      m.add(chaiscript::fun(&get_parse_tree), "get_parse_tree");

      m.add(chaiscript::base_class<std::runtime_error, chaiscript::exception::eval_error>());
      m.add(chaiscript::base_class<std::exception, chaiscript::exception::eval_error>());

      m.add(chaiscript::user_type<chaiscript::exception::arithmetic_error>(), "arithmetic_error");
      m.add(chaiscript::base_class<std::runtime_error, chaiscript::exception::arithmetic_error>());
      m.add(chaiscript::base_class<std::exception, chaiscript::exception::arithmetic_error>());

      //        chaiscript::bootstrap::standard_library::vector_type<std::vector<std::shared_ptr<chaiscript::AST_Node> >
      //        >("AST_NodeVector", m);

      chaiscript::utility::add_class<chaiscript::exception::eval_error>(m,
                                                                        "eval_error",
                                                                        {},
                                                                        {{fun(&chaiscript::exception::eval_error::reason), "reason"},
                                                                         {fun(&chaiscript::exception::eval_error::pretty_print), "pretty_print"},
                                                                         {fun([](const chaiscript::exception::eval_error &t_eval_error) {
                                                                            std::vector<Boxed_Value> retval;
                                                                            std::transform(t_eval_error.call_stack.begin(),
                                                                                           t_eval_error.call_stack.end(),
                                                                                           std::back_inserter(retval),
                                                                                           &chaiscript::var<const chaiscript::AST_Node_Trace &>);
                                                                            return retval;
                                                                          }),
                                                                          "call_stack"}});

      chaiscript::utility::add_class<chaiscript::File_Position>(m,
                                                                "File_Position",
                                                                {constructor<File_Position()>(), constructor<File_Position(int, int)>()},
                                                                {{fun(&File_Position::line), "line"},
                                                                 {fun(&File_Position::column), "column"}});

      chaiscript::utility::add_class<AST_Node>(m,
                                               "AST_Node",
                                               {},
                                               {{fun(&AST_Node::text), "text"},
                                                {fun(&AST_Node::identifier), "identifier"},
                                                {fun(&AST_Node::filename), "filename"},
                                                {fun(&AST_Node::start), "start"},
                                                {fun(&AST_Node::end), "end"},
                                                {fun(&AST_Node::to_string), "to_string"},
                                                {fun([](const chaiscript::AST_Node &t_node) -> std::vector<Boxed_Value> {
                                                   std::vector<Boxed_Value> retval;
                                                   const auto children = t_node.get_children();
                                                   std::transform(children.begin(),
                                                                  children.end(),
                                                                  std::back_inserter(retval),
                                                                  &chaiscript::var<const std::reference_wrapper<chaiscript::AST_Node> &>);
                                                   return retval;
                                                 }),
                                                 "children"}});
    }